

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall QtMWidgets::AbstractScrollArea::_q_animateScrollIndicators(AbstractScrollArea *this)

{
  int iVar1;
  QTimer *pQVar2;
  AbstractScrollAreaPrivate *pAVar3;
  AbstractScrollArea *this_local;
  
  pAVar3 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  iVar1 = pAVar3->animationAlphaDelta;
  pAVar3 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  pAVar3->horIndicator->alpha = pAVar3->horIndicator->alpha - iVar1;
  pAVar3 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  iVar1 = pAVar3->animationAlphaDelta;
  pAVar3 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  pAVar3->vertIndicator->alpha = pAVar3->vertIndicator->alpha - iVar1;
  pAVar3 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  if (pAVar3->horIndicator->alpha < 1) {
    pAVar3 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    AbstractScrollAreaPrivate::stopScrollIndicatorsAnimation(pAVar3);
  }
  else {
    pAVar3 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    if (((pAVar3->horIndicator->needPaint & 1U) != 0) ||
       (pAVar3 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
                 ::operator->(&this->d), (pAVar3->vertIndicator->needPaint & 1U) != 0)) {
      pAVar3 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
               ::operator->(&this->d);
      pQVar2 = pAVar3->animationTimer;
      QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
      ::operator->(&this->d);
      QTimer::start((int)pQVar2);
    }
  }
  pAVar3 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  if ((pAVar3->horIndicator->needPaint & 1U) != 0) {
    QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
    ::operator->(&this->d);
    QWidget::update();
  }
  pAVar3 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  if ((pAVar3->vertIndicator->needPaint & 1U) != 0) {
    QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
    ::operator->(&this->d);
    QWidget::update();
  }
  return;
}

Assistant:

void
AbstractScrollArea::_q_animateScrollIndicators()
{
	d->horIndicator->alpha -= d->animationAlphaDelta;
	d->vertIndicator->alpha -= d->animationAlphaDelta;

	if( d->horIndicator->alpha <= 0 )
		d->stopScrollIndicatorsAnimation();
	else if( d->horIndicator->needPaint || d->vertIndicator->needPaint )
		d->animationTimer->start( d->animationTimeout );

	if( d->horIndicator->needPaint )
		d->horIndicator->update();

	if( d->vertIndicator->needPaint )
		d->vertIndicator->update();
}